

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)2001>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BayesianProbitRegressor *pBVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Type *pTVar12;
  long *plVar13;
  ostream *poVar14;
  uint uVar15;
  size_type *psVar16;
  int iVar17;
  undefined1 *puVar18;
  size_type sVar19;
  char *pcVar20;
  _Alloc_hider _Var21;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  bool bVar22;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  byte local_212;
  allocator_type local_211;
  Result *local_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  undefined1 local_1f8 [8];
  _Alloc_hider local_1f0;
  undefined1 local_1e8 [24];
  RepeatedPtrFieldBase *local_1d0;
  TypeCase local_1c4;
  ModelDescription *local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  puVar18 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar18 == (ModelDescription *)0x0) {
    puVar18 = Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x7d1) {
    pBVar2 = (format->Type_).bayesianprobitregressor_;
    uVar3._0_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.current_size_;
    uVar3._4_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.total_size_;
    bVar22 = *(long *)(((ulong)(pBVar2->features_).super_RepeatedPtrFieldBase.rep_ &
                       0xfffffffffffffffe) + 8) != 0;
    uVar15 = bVar22 + 1;
    if (*(long *)((uVar3 & 0xfffffffffffffffe) + 8) == 0) {
      uVar15 = (uint)bVar22;
    }
    if ((((ModelDescription *)puVar18)->output_).super_RepeatedPtrFieldBase.current_size_ ==
        ((uVar15 - (*(long *)(((ulong)(pBVar2->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe) + 8) == 0)) + 2) -
        (uint)(*(long *)(((ulong)(pBVar2->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                         0xfffffffffffffffe) + 8) == 0)) {
      local_1d0 = &(((ModelDescription *)puVar18)->output_).super_RepeatedPtrFieldBase;
      iVar17 = (((ModelDescription *)puVar18)->output_).super_RepeatedPtrFieldBase.current_size_;
      bVar7 = 0 < iVar17;
      local_210 = __return_storage_ptr__;
      if (iVar17 < 1) {
        local_208 = -1;
        local_204 = -1;
        local_1fc = -1;
        local_200 = -1;
      }
      else {
        iVar17 = 0;
        local_200 = -1;
        local_1fc = -1;
        local_204 = -1;
        local_208 = -1;
        local_1c0 = (ModelDescription *)puVar18;
        do {
          local_212 = bVar7;
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_1d0,iVar17);
          plVar13 = (long *)((ulong)(pTVar12->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar4 = *plVar13;
          local_1b8 = (undefined1  [8])local_1a8;
          std::__cxx11::string::_M_construct<char*>((string *)local_1b8,lVar4,plVar13[1] + lVar4);
          uVar5._0_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.current_size_;
          uVar5._4_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.total_size_;
          iVar8 = std::__cxx11::string::compare((string *)(uVar5 & 0xfffffffffffffffe));
          if (iVar8 == 0) {
            local_200 = iVar17;
          }
          iVar9 = std::__cxx11::string::compare
                            ((string *)
                             ((ulong)(pBVar2->features_).super_RepeatedPtrFieldBase.rep_ &
                             0xfffffffffffffffe));
          if (iVar9 == 0) {
            local_1fc = iVar17;
          }
          iVar10 = std::__cxx11::string::compare
                             ((string *)
                              ((ulong)(pBVar2->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe));
          if (iVar10 == 0) {
            local_204 = iVar17;
          }
          iVar11 = std::__cxx11::string::compare
                             ((string *)
                              ((ulong)(pBVar2->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                              0xfffffffffffffffe));
          puVar18 = (undefined1 *)local_1c0;
          if (iVar11 == 0) {
            local_208 = iVar17;
          }
          if ((((iVar8 != 0) && (iVar9 != 0)) && (iVar10 != 0)) && (iVar11 != 0)) {
            std::operator+(&local_238,"Output feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
            puVar18 = (undefined1 *)local_1c0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_238);
            psVar16 = (size_type *)(plVar13 + 2);
            if ((size_type *)*plVar13 == psVar16) {
              local_1e8._0_8_ = *psVar16;
              local_1e8._8_8_ = plVar13[3];
              local_1f8 = (undefined1  [8])local_1e8;
            }
            else {
              local_1e8._0_8_ = *psVar16;
              local_1f8 = (undefined1  [8])*plVar13;
            }
            local_1f0._M_p = (pointer)plVar13[1];
            *plVar13 = (long)psVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(local_210,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_1f8);
            if (local_1f8 != (undefined1  [8])local_1e8) {
              operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            bVar7 = local_212;
            if (local_1b8 != (undefined1  [8])local_1a8) {
              operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
              bVar7 = local_212;
            }
            break;
          }
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
          iVar17 = iVar17 + 1;
          iVar8 = (((ModelDescription *)puVar18)->output_).super_RepeatedPtrFieldBase.current_size_;
          bVar7 = iVar17 < iVar8;
        } while (iVar17 < iVar8);
      }
      iVar17 = local_1fc;
      if ((bVar7 & 1) != 0) {
        return local_210;
      }
      if (local_1fc == -1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8,"Expected feature \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pBVar2->features_).super_RepeatedPtrFieldBase.rep_ &
                       0xfffffffffffffffe));
        plVar13 = (long *)std::__cxx11::string::append((char *)local_1f8);
        __return_storage_ptr__ = local_210;
        psVar16 = (size_type *)(plVar13 + 2);
        if ((size_type *)*plVar13 == psVar16) {
          local_1a8._0_8_ = *psVar16;
          local_1a8._8_8_ = plVar13[3];
          local_1b8 = (undefined1  [8])local_1a8;
        }
        else {
          local_1a8._0_8_ = *psVar16;
          local_1b8 = (undefined1  [8])*plVar13;
        }
        local_1b0._M_p = (pointer)plVar13[1];
        *plVar13 = (long)psVar16;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        Result::Result(local_210,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_1b8);
        if (local_1b8 != (undefined1  [8])local_1a8) {
          operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
        }
        sVar19 = local_1e8._0_8_;
        _Var21._M_p = (pointer)local_1f8;
        if (local_1f8 == (undefined1  [8])local_1e8) {
          return __return_storage_ptr__;
        }
        goto LAB_00336165;
      }
      Result::Result((Result *)local_1f8);
      local_1c4 = kStringType;
      __l._M_len = 1;
      __l._M_array = &local_1c4;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_238,__l,&local_211);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_1b8,(CoreML *)&((ModelDescription *)puVar18)->input_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_238,
                 in_R8);
      local_1f8 = local_1b8;
      std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1b0);
      if (local_1b0._M_p != local_1a8 + 8) {
        operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
      }
      if (local_238._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_238._M_dataplus._M_p,
                        local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
      }
      bVar22 = Result::good((Result *)local_1f8);
      __return_storage_ptr__ = local_210;
      if (bVar22) {
        uVar15 = (((ModelDescription *)puVar18)->output_).super_RepeatedPtrFieldBase.current_size_;
        local_1c4 = kSequenceType;
        __l_00._M_len = 1;
        __l_00._M_array = &local_1c4;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_238,__l_00,&local_211);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  ((Result *)local_1b8,(CoreML *)local_1d0,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar15,
                   (int)&local_238,in_R8);
        local_1f8 = local_1b8;
        std::__cxx11::string::operator=((string *)&local_1f0,(string *)&local_1b0);
        if (local_1b0._M_p != local_1a8 + 8) {
          operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
        }
        if (local_238._M_dataplus._M_p != (char *)0x0) {
          operator_delete(local_238._M_dataplus._M_p,
                          local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p
                         );
        }
        bVar22 = Result::good((Result *)local_1f8);
        __return_storage_ptr__ = local_210;
        if (!bVar22) goto LAB_0033641f;
        pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (local_1d0,iVar17);
        __return_storage_ptr__ = local_210;
        puVar18 = (undefined1 *)pTVar12->type_;
        if ((FeatureType *)puVar18 == (FeatureType *)0x0) {
          puVar18 = Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar18)->_oneof_case_[0] == 7) {
          puVar18 = (undefined1 *)(((FeatureType *)puVar18)->Type_).sequencetype_;
        }
        else {
          puVar18 = Specification::_SequenceFeatureType_default_instance_;
        }
        if (((SequenceFeatureType *)puVar18)->_oneof_case_[0] == 3) {
          if (local_200 != -1) {
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_1d0,local_200);
            puVar18 = (undefined1 *)pTVar12->type_;
            if ((FeatureType *)puVar18 == (FeatureType *)0x0) {
              puVar18 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar18)->_oneof_case_[0] == 7) {
              puVar18 = (undefined1 *)(((FeatureType *)puVar18)->Type_).sequencetype_;
            }
            else {
              puVar18 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar18)->_oneof_case_[0] != 3) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unsupported type \"",0x12);
              if ((ulong)((SequenceFeatureType *)puVar18)->_oneof_case_[0] < 9) {
                pcVar20 = (&PTR_anon_var_dwarf_7615e0_004bd2a8)
                          [((SequenceFeatureType *)puVar18)->_oneof_case_[0]];
              }
              else {
                pcVar20 = "INVALID";
              }
              poVar14 = std::operator<<((ostream *)local_1a8,pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" for feature \"",0xf);
              uVar6._0_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.current_size_;
              uVar6._4_4_ = (pBVar2->features_).super_RepeatedPtrFieldBase.total_size_;
              std::operator+(&local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (uVar6 & 0xfffffffffffffffe),"\". Should be: ");
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"MLFeatureTypeType_stringType",0x1c);
              __return_storage_ptr__ = local_210;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_00336a32;
            }
          }
          if (local_204 != -1) {
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_1d0,local_204);
            puVar18 = (undefined1 *)pTVar12->type_;
            if ((FeatureType *)puVar18 == (FeatureType *)0x0) {
              puVar18 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar18)->_oneof_case_[0] == 7) {
              puVar18 = (undefined1 *)(((FeatureType *)puVar18)->Type_).sequencetype_;
            }
            else {
              puVar18 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar18)->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unsupported type \"",0x12);
              if ((ulong)((SequenceFeatureType *)puVar18)->_oneof_case_[0] < 9) {
                pcVar20 = (&PTR_anon_var_dwarf_7615e0_004bd2a8)
                          [((SequenceFeatureType *)puVar18)->_oneof_case_[0]];
              }
              else {
                pcVar20 = "INVALID";
              }
              poVar14 = std::operator<<((ostream *)local_1a8,pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" for feature \"",0xf);
              std::operator+(&local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(pBVar2->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe),"\". Should be: ");
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"MLFeatureTypeType_int64Type",0x1b);
              __return_storage_ptr__ = local_210;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_00336a32;
            }
          }
          if (local_208 != -1) {
            pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_1d0,local_208);
            puVar18 = (undefined1 *)pTVar12->type_;
            if ((FeatureType *)puVar18 == (FeatureType *)0x0) {
              puVar18 = Specification::_FeatureType_default_instance_;
            }
            if (((FeatureType *)puVar18)->_oneof_case_[0] == 7) {
              puVar18 = (undefined1 *)(((FeatureType *)puVar18)->Type_).sequencetype_;
            }
            else {
              puVar18 = Specification::_SequenceFeatureType_default_instance_;
            }
            if (((SequenceFeatureType *)puVar18)->_oneof_case_[0] != 1) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unsupported type \"",0x12);
              if ((ulong)((SequenceFeatureType *)puVar18)->_oneof_case_[0] < 9) {
                pcVar20 = (&PTR_anon_var_dwarf_7615e0_004bd2a8)
                          [((SequenceFeatureType *)puVar18)->_oneof_case_[0]];
              }
              else {
                pcVar20 = "INVALID";
              }
              poVar14 = std::operator<<((ostream *)local_1a8,pcVar20);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" for feature \"",0xf);
              std::operator+(&local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)(pBVar2->optimisminputfeaturename_).tagged_ptr_.ptr_ &
                             0xfffffffffffffffe),"\". Should be: ");
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_238._M_dataplus._M_p,local_238._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"MLFeatureTypeType_int64Type",0x1b);
              __return_storage_ptr__ = local_210;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
              goto LAB_00336a32;
            }
          }
          if (*(int *)&(pBVar2->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ == 0) {
            local_1b8 = (undefined1  [8])local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Model revision number not set. Must be >= 1","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
          }
          else {
            iVar17 = *(int *)((long)&(pBVar2->varianceoutputfeaturename_).tagged_ptr_.ptr_ + 4);
            if (iVar17 == 0) {
LAB_00336ab0:
              local_1b8 = (undefined1  [8])local_1a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"Model output tags not set. Must have at least one tag"
                         ,"");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
            }
            else {
              if (iVar17 == 200) {
                if (iVar17 != 200) {
                  puVar18 = Specification::_StringVector_default_instance_;
                }
                else {
                  puVar18 = (undefined1 *)(pBVar2->meanoutputfeaturename_).tagged_ptr_.ptr_;
                }
                if (*(int *)(puVar18 + 0x18) < 1) goto LAB_00336ab0;
              }
              if (*(long *)(((ulong)(pBVar2->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8) != 0) goto LAB_0033641f;
              local_1b8 = (undefined1  [8])local_1a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b8,"Model parameter data not set","");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
            }
          }
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported type \"",0x12);
          if ((ulong)((SequenceFeatureType *)puVar18)->_oneof_case_[0] < 9) {
            pcVar20 = (&PTR_anon_var_dwarf_7615e0_004bd2a8)
                      [((SequenceFeatureType *)puVar18)->_oneof_case_[0]];
          }
          else {
            pcVar20 = "INVALID";
          }
          poVar14 = std::operator<<((ostream *)local_1a8,pcVar20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" for feature \"",0xf);
          std::operator+(&local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pBVar2->features_).super_RepeatedPtrFieldBase.rep_ &
                         0xfffffffffffffffe),"\". Should be: ");
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"MLFeatureTypeType_stringType",0x1c);
          __return_storage_ptr__ = local_210;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_238);
LAB_00336a32:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
LAB_0033641f:
        __return_storage_ptr__->m_type = local_1f8._0_4_;
        __return_storage_ptr__->m_reason = local_1f8._4_4_;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if (local_1f0._M_p == local_1e8 + 8) {
          paVar1->_M_allocated_capacity = local_1e8._8_8_;
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_1e8._16_8_
          ;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1f0._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity = local_1e8._8_8_;
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_1e8._0_8_;
        local_1e8._0_8_ = 0;
        local_1e8._8_8_ = local_1e8._8_8_ & 0xffffffffffffff00;
        local_1f0._M_p = local_1e8 + 8;
      }
      sVar19 = local_1e8._8_8_;
      _Var21._M_p = local_1f0._M_p;
      if (local_1f0._M_p == local_1e8 + 8) {
        return __return_storage_ptr__;
      }
      goto LAB_00336165;
    }
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "More model output features than the output features of the word tagger model.","");
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_1b8);
  }
  else {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Model not a word tagger.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
  }
  sVar19 = local_1a8._0_8_;
  _Var21._M_p = (pointer)local_1b8;
  if (local_1b8 == (undefined1  [8])local_1a8) {
    return __return_storage_ptr__;
  }
LAB_00336165:
  operator_delete(_Var21._M_p,sVar19 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }